

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

void al_hold_bitmap_drawing(_Bool hold)

{
  ALLEGRO_DISPLAY *pAVar1;
  ALLEGRO_TRANSFORM *pAVar2;
  ALLEGRO_TRANSFORM ident;
  ALLEGRO_TRANSFORM old;
  ALLEGRO_TRANSFORM local_a0;
  ALLEGRO_TRANSFORM local_60;
  
  pAVar1 = al_get_current_display();
  if (pAVar1 != (ALLEGRO_DISPLAY *)0x0) {
    if (!hold) {
      pAVar1->cache_enabled = hold;
      (*pAVar1->vt->flush_vertex_cache)(pAVar1);
      pAVar2 = al_get_current_transform();
      al_use_transform(pAVar2);
      return;
    }
    if (pAVar1->cache_enabled == true) {
      pAVar1->cache_enabled = hold;
    }
    else {
      pAVar2 = al_get_current_transform();
      al_copy_transform(&local_60,pAVar2);
      al_identity_transform(&local_a0);
      al_use_transform(&local_a0);
      pAVar1->cache_enabled = hold;
      al_use_transform(&local_60);
    }
  }
  return;
}

Assistant:

void al_hold_bitmap_drawing(bool hold)
{
   ALLEGRO_DISPLAY *current_display = al_get_current_display();

   if (current_display) {
      if (hold && !current_display->cache_enabled) {
         /*
          * Set the hardware transformation to identity, but keep the bitmap
          * transform the same as it was. Relies on the fact that when bitmap
          * holding is turned on, al_use_transform does not update the hardware
          * transformation.
          */
         ALLEGRO_TRANSFORM old, ident;
         al_copy_transform(&old, al_get_current_transform());
         al_identity_transform(&ident);

         al_use_transform(&ident);
         current_display->cache_enabled = hold;
         al_use_transform(&old);
      }
      else {
         current_display->cache_enabled = hold;
      }

      if (!hold) {
         current_display->vt->flush_vertex_cache(current_display);
         /*
          * Reset the hardware transform to match the stored transform.
          */
         al_use_transform(al_get_current_transform());
      }
   }
}